

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O1

int __thiscall
vkt::FunctionPrograms1<vkt::SpirVAssembly::InstanceContext>::init
          (FunctionPrograms1<vkt::SpirVAssembly::InstanceContext> *this,EVP_PKEY_CTX *ctx)

{
  Function p_Var1;
  InstanceContext IVar2;
  int extraout_EAX;
  long in_RDX;
  undefined1 in_stack_ffffffffffffff08 [192];
  _Alloc_hider in_stack_ffffffffffffffc8;
  size_type in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  
  p_Var1 = this->m_func;
  SpirVAssembly::InstanceContext::InstanceContext
            ((InstanceContext *)&stack0xffffffffffffff08,(InstanceContext *)(in_RDX + 8));
  IVar2.failMessageTemplate._M_dataplus._M_p = in_stack_ffffffffffffffc8._M_p;
  IVar2.moduleMap._M_t._M_impl = (_Rep_type)(_Rep_type)in_stack_ffffffffffffff08._0_48_;
  IVar2.inputColors[0].m_value = in_stack_ffffffffffffff08._48_4_;
  IVar2.inputColors[1].m_value = in_stack_ffffffffffffff08._52_4_;
  IVar2.inputColors[2].m_value = in_stack_ffffffffffffff08._56_4_;
  IVar2.inputColors[3].m_value = in_stack_ffffffffffffff08._60_4_;
  IVar2.outputColors[0].m_value = in_stack_ffffffffffffff08._64_4_;
  IVar2.outputColors[1].m_value = in_stack_ffffffffffffff08._68_4_;
  IVar2.outputColors[2].m_value = in_stack_ffffffffffffff08._72_4_;
  IVar2.outputColors[3].m_value = in_stack_ffffffffffffff08._76_4_;
  IVar2.testCodeFragments._M_t._M_impl = (_Rep_type)(_Rep_type)in_stack_ffffffffffffff08._80_48_;
  IVar2.specConstants._M_t._M_impl = (_Rep_type)(_Rep_type)in_stack_ffffffffffffff08._128_48_;
  IVar2.hasTessellation = (bool)in_stack_ffffffffffffff08[0xb0];
  IVar2._177_3_ = in_stack_ffffffffffffff08._177_3_;
  IVar2.requiredStages = in_stack_ffffffffffffff08._180_4_;
  IVar2.failResult = in_stack_ffffffffffffff08._184_4_;
  IVar2._188_4_ = in_stack_ffffffffffffff08._188_4_;
  IVar2.failMessageTemplate._M_string_length = in_stack_ffffffffffffffd0;
  IVar2.failMessageTemplate.field_2._M_allocated_capacity = in_stack_ffffffffffffffd8;
  IVar2.failMessageTemplate.field_2._8_8_ = in_stack_ffffffffffffffe0;
  (*p_Var1)((SourceCollections *)ctx,IVar2);
  if (in_stack_ffffffffffffffc8._M_p != &stack0xffffffffffffffd8) {
    operator_delete(in_stack_ffffffffffffffc8._M_p,in_stack_ffffffffffffffd8 + 1);
  }
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)&stack0xffffffffffffff88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&stack0xffffffffffffff58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
               *)&stack0xffffffffffffff08);
  return extraout_EAX;
}

Assistant:

void			init			(vk::SourceCollections& dst, const typename FunctionInstance1<Arg0>::Args& args) const { m_func(dst, args.arg0); }